

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Reader __thiscall
capnp::_::PointerReader::getBlob<capnp::Text>
          (PointerReader *this,void *defaultValue,ByteCount defaultSize)

{
  word *pwVar1;
  Arena *pAVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  WirePointer *pWVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  WirePointer *pWVar12;
  WirePointer *pWVar13;
  Reader RVar14;
  SegmentReader *pSVar5;
  
  pSVar5 = this->segment;
  pWVar12 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar12 = this->pointer;
  }
  if (pSVar5 == (SegmentReader *)0x0) {
    uVar8 = (uint)*(uint64_t *)&(pWVar12->offsetAndKind).value;
    if ((pWVar12->field_1).upper32Bits != 0 || uVar8 != 0) {
      pWVar7 = pWVar12 + (long)((int)uVar8 >> 2) + 1;
      pSVar5 = (SegmentReader *)0x0;
LAB_0017fa92:
      if ((uVar8 & 3) == 1) {
        uVar8 = (pWVar12->field_1).upper32Bits;
        if ((uVar8 & 7) == 2) {
          if (pSVar5 == (SegmentReader *)0x0) {
LAB_0017fae0:
            if (uVar8 < 8) {
              getBlob<capnp::Text>();
            }
            else {
              uVar9 = (ulong)((uVar8 >> 3) - 1);
              if (*(char *)((long)&(pWVar7->offsetAndKind).value + uVar9) == '\0')
              goto LAB_0017fb38;
              getBlob<capnp::Text>();
            }
          }
          else {
            uVar9 = (ulong)((uVar8 >> 3) + 7 >> 3);
            if (((long)pWVar7 - (long)(pSVar5->ptr).ptr >> 3) + uVar9 <= (pSVar5->ptr).size_) {
              uVar6 = pSVar5->readLimiter->limit;
              if (uVar9 <= uVar6) {
                pSVar5->readLimiter->limit = uVar6 - uVar9;
                goto LAB_0017fae0;
              }
              (*pSVar5->arena->_vptr_Arena[3])();
            }
            getBlob<capnp::Text>();
          }
        }
        else {
          getBlob<capnp::Text>();
        }
      }
      else {
        getBlob<capnp::Text>();
      }
    }
  }
  else {
    uVar8 = (uint)*(uint64_t *)&(pWVar12->offsetAndKind).value;
    if ((pWVar12->field_1).upper32Bits != 0 || uVar8 != 0) {
      pwVar1 = (pSVar5->ptr).ptr;
      pWVar13 = (WirePointer *)(pwVar1 + (pSVar5->ptr).size_);
      lVar10 = (long)((int)uVar8 >> 2);
      pWVar7 = pWVar12 + lVar10 + 1;
      if ((long)pWVar13 - (long)(pWVar12 + 1) >> 3 < lVar10) {
        pWVar7 = pWVar13;
      }
      if (lVar10 < (long)pwVar1 - (long)(pWVar12 + 1) >> 3) {
        pWVar7 = pWVar13;
      }
      if ((uVar8 & 3) == 2) {
        iVar4 = (*pSVar5->arena->_vptr_Arena[2])();
        pSVar5 = (SegmentReader *)CONCAT44(extraout_var,iVar4);
        if (pSVar5 == (SegmentReader *)0x0) {
          getBlob<capnp::Text>();
        }
        else {
          uVar9 = (pSVar5->ptr).size_;
          uVar8 = (uint)*(uint64_t *)&(pWVar12->offsetAndKind).value;
          uVar6 = (ulong)(uVar8 >> 3);
          if ((long)uVar9 < (long)(ulong)(uVar8 >> 3)) {
            uVar6 = uVar9;
          }
          uVar11 = 2 - (ulong)((uVar8 & 4) == 0);
          if (uVar6 + uVar11 <= uVar9) {
            pwVar1 = (pSVar5->ptr).ptr;
            pAVar2 = pSVar5->arena;
            uVar3 = pSVar5->readLimiter->limit;
            if (uVar11 <= uVar3) {
              pWVar13 = (WirePointer *)(pwVar1 + uVar6);
              pWVar12 = pWVar13 + 1;
              pSVar5->readLimiter->limit = uVar3 - uVar11;
              if ((uVar8 & 4) == 0) {
                uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
                lVar10 = (long)((int)uVar8 >> 2);
                pWVar7 = (WirePointer *)(pwVar1 + uVar9);
                if (((long)pwVar1 - (long)pWVar12 >> 3 <= lVar10) &&
                   (lVar10 <= (long)pWVar7 - (long)pWVar12 >> 3)) {
                  pWVar7 = pWVar12 + lVar10;
                  pWVar12 = pWVar13;
                  goto LAB_0017fa92;
                }
                goto LAB_0017fa8f;
              }
              iVar4 = (*pAVar2->_vptr_Arena[2])(pAVar2,(ulong)(pWVar13->field_1).upper32Bits);
              pSVar5 = (SegmentReader *)CONCAT44(extraout_var_00,iVar4);
              if (pSVar5 == (SegmentReader *)0x0) {
                getBlob<capnp::Text>();
              }
              else {
                uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
                if ((uVar8 & 3) == 2) {
                  uVar6 = (ulong)(uVar8 >> 3);
                  uVar9 = (pSVar5->ptr).size_;
                  if ((long)uVar9 < (long)uVar6) {
                    uVar6 = uVar9;
                  }
                  pWVar7 = (WirePointer *)((pSVar5->ptr).ptr + uVar6);
                  goto LAB_0017fa86;
                }
                getBlob<capnp::Text>();
              }
              goto LAB_0017fb28;
            }
            (*pAVar2->_vptr_Arena[3])();
          }
          getBlob<capnp::Text>();
        }
      }
      else {
LAB_0017fa86:
        pWVar13 = pWVar12;
        if (pWVar7 != (WirePointer *)0x0) {
LAB_0017fa8f:
          uVar8 = (uint)*(uint64_t *)&(pWVar13->offsetAndKind).value;
          pWVar12 = pWVar13;
          goto LAB_0017fa92;
        }
      }
    }
  }
LAB_0017fb28:
  pWVar7 = (WirePointer *)0x1dcce1;
  if (defaultValue != (void *)0x0) {
    pWVar7 = (WirePointer *)defaultValue;
  }
  uVar9 = (ulong)defaultSize;
LAB_0017fb38:
  RVar14.super_StringPtr.content.size_ = uVar9 + 1;
  RVar14.super_StringPtr.content.ptr = (char *)pWVar7;
  return (Reader)RVar14.super_StringPtr.content;
}

Assistant:

Text::Reader PointerReader::getBlob<Text>(const void* defaultValue, ByteCount defaultSize) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readTextPointer(segment, ref, defaultValue, defaultSize);
}